

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

void __thiscall covenant::CFGConnect::scc(CFGConnect *this,CFG *g)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  iterator __first;
  iterator __last;
  EVP_PKEY_CTX *in_RSI;
  CFGConnect *in_RDI;
  uint i;
  VID in_stack_0000003c;
  CFGConnect *in_stack_00000040;
  CFG *in_stack_00000098;
  CFGConnect *in_stack_000000a0;
  uint local_14;
  
  cleanup(in_RDI,in_RSI);
  SCC_Init(in_stack_000000a0,in_stack_00000098);
  std::vector<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>::size
            (&in_RDI->verts);
  SCC_Compute(in_stack_00000040,in_stack_0000003c);
  std::vector<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>::
  pop_back((vector<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
            *)0x220258);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::pop_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x220266);
  local_14 = 0;
  while( true ) {
    this_00 = (vector<int,_std::allocator<int>_> *)(ulong)local_14;
    pvVar1 = (vector<int,_std::allocator<int>_> *)
             std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::size(&in_RDI->groups);
    if (pvVar1 <= this_00) break;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&in_RDI->groups,(ulong)local_14);
    __first = std::vector<int,_std::allocator<int>_>::begin(this_00);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&in_RDI->groups,(ulong)local_14);
    __last = std::vector<int,_std::allocator<int>_>::end(this_00);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void scc(CFG& g){
      cleanup();
      SCC_Init(g);
      SCC_Compute(verts.size()-1);
      
      // Eliminate the fake vertex.
      verts.pop_back();
      groups.pop_back();

      // Sort to make queries more efficient
      for (unsigned int i=0; i < groups.size(); i++){
	sort(groups[i].begin(), groups[i].end());
      }
    }